

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int KINPicardAA(KINMem kin_mem)

{
  int iVar1;
  uint uVar2;
  KINMem in_RDI;
  sunrealtype sVar3;
  sunrealtype in_stack_00000008;
  KINMem in_stack_00000010;
  sunrealtype fnormp;
  sunrealtype epsmin;
  N_Vector delta;
  long iter_aa;
  int ret;
  int retval;
  long in_stack_00000078;
  N_Vector in_stack_00000080;
  N_Vector in_stack_00000088;
  N_Vector in_stack_00000090;
  N_Vector in_stack_00000098;
  KINMem in_stack_000000a0;
  sunrealtype *in_stack_000000d0;
  sunrealtype *in_stack_000000d8;
  N_Vector in_stack_ffffffffffffffb8;
  KINMem in_stack_ffffffffffffffc0;
  KINMem in_stack_ffffffffffffffc8;
  N_Vector gval;
  KINMem kin_mem_00;
  uint local_10;
  
  local_10 = 0xfffffc19;
  kin_mem_00 = (KINMem)0x0;
  gval = (N_Vector)&DAT_bff0000000000000;
  in_RDI->kin_nni = 0;
  if ((in_RDI->kin_inexact_ls != 0) && (in_RDI->kin_noMinEps == 0)) {
    kin_mem_00 = (KINMem)(in_RDI->kin_fnormtol * 0.01);
  }
  do {
    uVar2 = local_10;
    if (local_10 != 0xfffffc19) {
LAB_0010ccd5:
      local_10 = uVar2;
      KINPrintInfo(in_RDI,1,"KINSOL","KINPicardAA","Return value: %d",(ulong)local_10);
      return local_10;
    }
    in_RDI->kin_nni = in_RDI->kin_nni + 1;
    if ((in_RDI->kin_inexact_ls != 0) &&
       (in_RDI->kin_eps = (in_RDI->kin_eta + in_RDI->kin_uround) * in_RDI->kin_fnorm,
       in_RDI->kin_noMinEps == 0)) {
      in_stack_ffffffffffffffc8 = kin_mem_00;
      if ((double)kin_mem_00 < in_RDI->kin_eps || (double)kin_mem_00 == in_RDI->kin_eps) {
        in_stack_ffffffffffffffc8 = (KINMem)in_RDI->kin_eps;
      }
      in_RDI->kin_eps = (sunrealtype)in_stack_ffffffffffffffc8;
    }
    iVar1 = KINPicardFcnEval(kin_mem_00,gval,(N_Vector)in_stack_ffffffffffffffc8,
                             (N_Vector)in_stack_ffffffffffffffc0);
    if (iVar1 < 0) {
      local_10 = 0xfffffff3;
      uVar2 = local_10;
      goto LAB_0010ccd5;
    }
    if ((in_RDI->kin_m_aa == 0) || (in_RDI->kin_nni + -1 < in_RDI->kin_delay_aa)) {
      if ((in_RDI->kin_damping == 0) && (in_RDI->kin_damping_fn == (KINDampingFn)0x0)) {
        N_VScale(0x3ff0000000000000,in_RDI->kin_gval,in_RDI->kin_unew);
      }
      else {
        if (in_RDI->kin_damping_fn != (KINDampingFn)0x0) {
          in_stack_ffffffffffffffb8 = (N_Vector)&in_RDI->kin_beta;
          iVar1 = (*in_RDI->kin_damping_fn)
                            (in_RDI->kin_nni,in_RDI->kin_uu,in_RDI->kin_fval,(sunrealtype *)0x0,0,
                             in_RDI->kin_user_data,(sunrealtype *)in_stack_ffffffffffffffb8);
          if (iVar1 != 0) {
            KINProcessError(in_RDI,-0x12,0xa66,"KINPicardAA",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,"The damping function failed.");
            local_10 = 0xffffffee;
            uVar2 = local_10;
            goto LAB_0010ccd5;
          }
          if ((in_RDI->kin_beta <= 0.0) || (1.0 < in_RDI->kin_beta)) {
            KINProcessError(in_RDI,-0x12,0xa6d,"KINPicardAA",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,"The damping parameter is outside of the range (0, 1].");
            local_10 = 0xffffffee;
            uVar2 = local_10;
            goto LAB_0010ccd5;
          }
        }
        N_VLinearSum(1.0 - in_RDI->kin_beta,in_RDI->kin_beta,in_RDI->kin_uu,in_RDI->kin_gval,
                     in_RDI->kin_unew);
      }
    }
    else {
      in_stack_ffffffffffffffb8 = (N_Vector)in_RDI->kin_R_aa;
      in_stack_ffffffffffffffc0 = (KINMem)in_RDI->kin_gamma_aa;
      uVar2 = AndersonAcc(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
                          in_stack_00000080,in_stack_00000078,in_stack_000000d0,in_stack_000000d8);
      if (uVar2 != 0) goto LAB_0010ccd5;
    }
    iVar1 = (*in_RDI->kin_func)(in_RDI->kin_unew,in_RDI->kin_fval,in_RDI->kin_user_data);
    in_RDI->kin_nfe = in_RDI->kin_nfe + 1;
    if (iVar1 < 0) {
      local_10 = 0xfffffff3;
      uVar2 = local_10;
      goto LAB_0010ccd5;
    }
    sVar3 = KINScFNorm(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(N_Vector)0x10cb90);
    in_RDI->kin_fnorm = sVar3;
    KINPrintInfo((KINMem)in_RDI->kin_fnorm,(int)in_RDI,(char *)0x4,"KINSOL","KINPicardAA",
                 "scaled f norm (for stopping) = %12.3lg");
    in_stack_ffffffffffffffb8 = (N_Vector)in_RDI->kin_nfe;
    KINPrintInfo((KINMem)in_RDI->kin_fnorm,(int)in_RDI,(char *)0x2,"KINSOL","KINPicardAA",
                 "nni = %4ld, nfe = %6ld, fnorm = %26.16lg",in_RDI->kin_nni);
    if (in_RDI->kin_mxiter <= in_RDI->kin_nni) {
      local_10 = 0xfffffffa;
    }
    if (in_RDI->kin_fnorm <= in_RDI->kin_fnormtol) {
      local_10 = 0;
    }
    N_VScale(0x3ff0000000000000,in_RDI->kin_unew,in_RDI->kin_uu);
    if ((local_10 == 0xfffffc19) && (in_RDI->kin_callForcingTerm != 0)) {
      gval = (N_Vector)N_VWL2Norm(in_RDI->kin_fval,in_RDI->kin_fscale);
      KINForcingTerm(in_stack_00000010,in_stack_00000008);
    }
  } while( true );
}

Assistant:

static int KINPicardAA(KINMem kin_mem)
{
  int retval;       /* return value from user func */
  int ret;          /* iteration status            */
  long int iter_aa; /* iteration count for AA      */
  N_Vector delta;   /* temporary workspace vector  */
  sunrealtype epsmin;
  sunrealtype fnormp;

  delta  = kin_mem->kin_vtemp1;
  ret    = CONTINUE_ITERATIONS;
  epsmin = ZERO;
  fnormp = -ONE;

  /* initialize iteration count */
  kin_mem->kin_nni = 0;

  /* if eps is to be bounded from below, set the bound */
  if (kin_mem->kin_inexact_ls && !(kin_mem->kin_noMinEps))
  {
    epsmin = POINT01 * kin_mem->kin_fnormtol;
  }

  while (ret == CONTINUE_ITERATIONS)
  {
    /* update iteration count */
    kin_mem->kin_nni++;

    /* Update the forcing term for the inexact linear solves */
    if (kin_mem->kin_inexact_ls)
    {
      kin_mem->kin_eps = (kin_mem->kin_eta + kin_mem->kin_uround) *
                         kin_mem->kin_fnorm;
      if (!(kin_mem->kin_noMinEps))
      {
        kin_mem->kin_eps = SUNMAX(epsmin, kin_mem->kin_eps);
      }
    }

    /* evaluate g = uu - L^{-1}func(uu) and return if failed.
       For Picard, assume that the fval vector has been filled
       with an eval of the nonlinear residual prior to this call. */
    retval = KINPicardFcnEval(kin_mem, kin_mem->kin_gval, kin_mem->kin_uu,
                              kin_mem->kin_fval);

    if (retval < 0)
    {
      ret = KIN_SYSFUNC_FAIL;
      break;
    }

    /* compute new solution */
    if (kin_mem->kin_m_aa == 0 || kin_mem->kin_nni - 1 < kin_mem->kin_delay_aa)
    {
      if (kin_mem->kin_damping || kin_mem->kin_damping_fn)
      {
        if (kin_mem->kin_damping_fn)
        {
          retval = kin_mem->kin_damping_fn(kin_mem->kin_nni, kin_mem->kin_uu,
                                           kin_mem->kin_fval, NULL, 0,
                                           kin_mem->kin_user_data,
                                           &(kin_mem->kin_beta));
          if (retval)
          {
            KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                            __FILE__, "The damping function failed.");
            ret = KIN_DAMPING_FN_ERR;
            break;
          }
          if (kin_mem->kin_beta <= ZERO || kin_mem->kin_beta > ONE)
          {
            KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                            __FILE__, "The damping parameter is outside of the range (0, 1].");
            ret = KIN_DAMPING_FN_ERR;
            break;
          }
        }

        /* damped fixed point */
        N_VLinearSum((ONE - kin_mem->kin_beta), kin_mem->kin_uu,
                     kin_mem->kin_beta, kin_mem->kin_gval, kin_mem->kin_unew);
      }
      else
      {
        /* standard fixed point */
        N_VScale(ONE, kin_mem->kin_gval, kin_mem->kin_unew);
      }
    }
    else
    {
      /* compute iteration count for Anderson acceleration */
      if (kin_mem->kin_delay_aa > 0)
      {
        iter_aa = kin_mem->kin_nni - 1 - kin_mem->kin_delay_aa;
      }
      else { iter_aa = kin_mem->kin_nni - 1; }

      retval = AndersonAcc(kin_mem,           /* kinsol memory            */
                           kin_mem->kin_gval, /* G(u_cur)       in        */
                           delta,             /* F(u_cur)       in (temp) */
                           kin_mem->kin_unew, /* u_new output   out       */
                           kin_mem->kin_uu,   /* u_cur input    in        */
                           iter_aa,           /* AA iteration   in        */
                           kin_mem->kin_R_aa, /* R matrix       in/out    */
                           kin_mem->kin_gamma_aa); /* gamma vector   in (temp) */
      if (retval)
      {
        ret = retval;
        break;
      }
    }

    /* Fill the Newton residual based on the new solution iterate */
    retval = kin_mem->kin_func(kin_mem->kin_unew, kin_mem->kin_fval,
                               kin_mem->kin_user_data);
    kin_mem->kin_nfe++;

    if (retval < 0)
    {
      ret = KIN_SYSFUNC_FAIL;
      break;
    }

    /* Measure || F(x) ||_max */
    kin_mem->kin_fnorm = KINScFNorm(kin_mem, kin_mem->kin_fval,
                                    kin_mem->kin_fscale);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_FMAX, "KINSOL", __func__, INFO_FMAX,
                 kin_mem->kin_fnorm);
#endif

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    /* print the current iter, fnorm, and nfe values */
    KINPrintInfo(kin_mem, PRNT_NNI, "KINSOL", __func__, INFO_NNI,
                 kin_mem->kin_nni, kin_mem->kin_nfe, kin_mem->kin_fnorm);
#endif

    /* Check if the maximum number of iterations is reached */
    if (kin_mem->kin_nni >= kin_mem->kin_mxiter) { ret = KIN_MAXITER_REACHED; }
    if (kin_mem->kin_fnorm <= kin_mem->kin_fnormtol) { ret = KIN_SUCCESS; }

    /* Update the solution. Always return the newest iteration. Note this is
       also consistent with last function evaluation. */
    N_VScale(ONE, kin_mem->kin_unew, kin_mem->kin_uu);

    if (ret == CONTINUE_ITERATIONS && kin_mem->kin_callForcingTerm)
    {
      /* evaluate eta by calling the forcing term routine */
      fnormp = N_VWL2Norm(kin_mem->kin_fval, kin_mem->kin_fscale);
      KINForcingTerm(kin_mem, fnormp);
    }

  } /* end of loop; return */
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
  KINPrintInfo(kin_mem, PRNT_RETVAL, "KINSOL", __func__, INFO_RETVAL, ret);
#endif

  return (ret);
}